

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O3

double units::convert<units::unit,units::precise_unit>
                 (double val,unit *start,precise_unit *result,double baseValue)

{
  unit_data uVar1;
  unit_data uVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  unit local_20;
  unit local_18;
  
  bVar3 = precise_unit::operator==(result,start);
  dVar5 = val;
  if (!bVar3) {
    uVar1 = start->base_units_;
    if (start->multiplier_ != 1.0 || uVar1 != (unit_data)0x30000000) {
      uVar2 = result->base_units_;
      if (result->multiplier_ != 1.0 || uVar2 != (unit_data)0x30000000) {
        if (uVar2 == uVar1) {
          dVar5 = ((double)start->multiplier_ * val) / result->multiplier_;
        }
        else {
          uVar4 = (uint)uVar1 ^ (uint)uVar2;
          if ((uVar4 >> 0x1c & 1) == 0) {
            if ((((((uint)uVar1 | (uint)uVar2) >> 0x1e & 1) == 0) || ((uVar4 & 0xfffffff) != 0)) ||
               (dVar5 = detail::convertFlaggedUnits<units::unit,units::precise_unit>
                                  (val,start,result,baseValue), NAN(dVar5))) {
              dVar5 = convert<units::unit,units::precise_unit>(val,start,result);
              return dVar5;
            }
          }
          else {
            if ((uVar4 & 0xfffffff) != 0) {
              local_18 = *start;
              bVar3 = unit::operator==((unit *)&pu,&local_18);
              if (!bVar3) {
                local_20.multiplier_ = (float)result->multiplier_;
                local_20.base_units_ = result->base_units_;
                bVar3 = unit::operator==((unit *)&pu,&local_20);
                if (!bVar3) {
                  return NAN;
                }
              }
            }
            if (((start->base_units_).field_0x3 & 0x10) != 0) {
              val = val * baseValue;
            }
            dVar5 = ((double)start->multiplier_ * val) / result->multiplier_;
            if (((result->base_units_).field_0x3 & 0x10) != 0) {
              dVar5 = dVar5 / baseValue;
            }
          }
        }
      }
    }
  }
  return dVar5;
}

Assistant:

double convert(double val, const UX& start, const UX2& result, double baseValue)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }

    // if the per unit is equivalent, no baseValue is needed so give to first
    // function
    if (start.is_per_unit() == result.is_per_unit()) {
        if ((start.has_e_flag() || result.has_e_flag()) &&
            start.has_same_base(result.base_units())) {
            double converted_val =
                detail::convertFlaggedUnits(val, start, result, baseValue);
            if (!std::isnan(converted_val)) {
                return converted_val;
            }
        }
        return convert(val, start, result);
    }

    if (start.has_same_base(result.base_units()) || pu == unit_cast(start) ||
        pu == unit_cast(result)) {
        if (start.is_per_unit()) {
            val = val * baseValue;
        }
        val = val * start.multiplier() / result.multiplier();
        if (result.is_per_unit()) {
            val /= baseValue;
        }
        return val;
    }
    // this would require two base values which power might be assumed but
    // assuming a base voltage is dangerous
    return constants::invalid_conversion;
}